

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
expression_tree::parallel::
evaluate<std::__cxx11::string,expression_tree::cache_on_assignment,expression_tree::parallel>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,parallel *this,operation<std::__cxx11::basic_string<char>_> *o,
          node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_assignment,_expression_tree::parallel>
          *l,node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_assignment,_expression_tree::parallel>
             *r)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> t;
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_assignment,_expression_tree::parallel>
  *local_48;
  undefined8 local_40;
  undefined1 local_38 [8];
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> f;
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_assignment,_expression_tree::parallel>
  *r_local;
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_assignment,_expression_tree::parallel>
  *l_local;
  operation<std::__cxx11::basic_string<char>_> *o_local;
  
  local_48 = (node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_assignment,_expression_tree::parallel>
              *)node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_assignment,_expression_tree::parallel>
                ::evaluate;
  local_40 = 0;
  t.field_2._8_8_ = o;
  f.
  super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)l;
  std::
  async<std::__cxx11::string(expression_tree::node<std::__cxx11::string,expression_tree::cache_on_assignment,expression_tree::parallel>::*)()const,expression_tree::node<std::__cxx11::string,expression_tree::cache_on_assignment,expression_tree::parallel>const*>
            ((type *)local_38,&local_48);
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_assignment,_expression_tree::parallel>
  ::evaluate((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
             (node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_assignment,_expression_tree::parallel>
              *)f.
                super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi);
  std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&local_a0,
             (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_38);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()(__return_storage_ptr__,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)this,&local_a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)local_70);
  std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~future((future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_38);
  return __return_storage_ptr__;
}

Assistant:

static T evaluate(const detail::operation<T>& o, const node<T, C, E>& l, const node<T, C, E>& r)
	{
		std::future<T> f = std::async(&node<T, C, E>::evaluate, &l);

		// Let's not rely on any assumption of parameter evaluation order...
		T t = r.evaluate();

		return o(f.get(), t);
	}